

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O3

void __thiscall
testing::internal::StreamingListener::OnTestPartResult
          (StreamingListener *this,TestPartResult *test_part_result)

{
  size_type *psVar1;
  StreamingListener *pSVar2;
  long *plVar3;
  undefined8 *puVar4;
  long *plVar5;
  ulong *puVar6;
  char **ppcVar7;
  char *in_RDX;
  StreamingListener *this_00;
  ulong uVar8;
  char *pcVar9;
  undefined8 uVar10;
  string local_138;
  int local_114;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  string local_f0;
  string local_d0;
  char **local_b0;
  char *local_a8;
  char *local_a0;
  long lStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  string local_70;
  long *local_50;
  undefined8 local_48;
  long local_40;
  undefined8 uStack_38;
  
  pSVar2 = (StreamingListener *)(test_part_result->file_name_)._M_string_length;
  if (pSVar2 != (StreamingListener *)0x0) {
    pSVar2 = (StreamingListener *)(test_part_result->file_name_)._M_dataplus._M_p;
  }
  this_00 = (StreamingListener *)0x1490ea;
  if (pSVar2 != (StreamingListener *)0x0) {
    this_00 = pSVar2;
  }
  UrlEncode_abi_cxx11_(&local_138,this_00,in_RDX);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,0x14a197);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_100 = *plVar5;
    lStack_f8 = plVar3[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *plVar5;
    local_110 = (long *)*plVar3;
  }
  local_108 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_110);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_80 = *puVar6;
    lStack_78 = plVar3[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar6;
    local_90 = (ulong *)*plVar3;
  }
  local_88 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_114 = test_part_result->line_number_;
  StreamableToString<int>(&local_f0,&local_114);
  uVar8 = 0xf;
  if (local_90 != &local_80) {
    uVar8 = local_80;
  }
  if (uVar8 < local_f0._M_string_length + local_88) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar10 = local_f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_f0._M_string_length + local_88) goto LAB_00140f2e;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_90);
  }
  else {
LAB_00140f2e:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_f0._M_dataplus._M_p);
  }
  local_50 = &local_40;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_40 = *plVar3;
    uStack_38 = puVar4[3];
  }
  else {
    local_40 = *plVar3;
    local_50 = (long *)*puVar4;
  }
  local_48 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  ppcVar7 = (char **)(plVar3 + 2);
  if ((char **)*plVar3 == ppcVar7) {
    local_a0 = *ppcVar7;
    lStack_98 = plVar3[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *ppcVar7;
    local_b0 = (char **)*plVar3;
  }
  local_a8 = (char *)plVar3[1];
  *plVar3 = (long)ppcVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  UrlEncode_abi_cxx11_
            (&local_d0,(StreamingListener *)(test_part_result->message_)._M_dataplus._M_p,local_a8);
  pcVar9 = (char *)0xf;
  if (local_b0 != &local_a0) {
    pcVar9 = local_a0;
  }
  if (pcVar9 < local_a8 + local_d0._M_string_length) {
    uVar10 = (char *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      uVar10 = local_d0.field_2._M_allocated_capacity;
    }
    if (local_a8 + local_d0._M_string_length <= (ulong)uVar10) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_b0);
      goto LAB_0014106f;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_d0._M_dataplus._M_p);
LAB_0014106f:
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  psVar1 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_70.field_2._M_allocated_capacity = *psVar1;
    local_70.field_2._8_8_ = puVar4[3];
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar1;
    local_70._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_70._M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  AbstractSocketWriter::SendLn((this->socket_writer_).ptr_,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,(ulong)(local_d0.field_2._M_allocated_capacity + 1));
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,(ulong)(local_a0 + 1));
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void OnTestPartResult(const TestPartResult& test_part_result) {
    const char* file_name = test_part_result.file_name();
    if (file_name == NULL)
      file_name = "";
    SendLn("event=TestPartResult&file=" + UrlEncode(file_name) +
           "&line=" + StreamableToString(test_part_result.line_number()) +
           "&message=" + UrlEncode(test_part_result.message()));
  }